

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O1

unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
 duckdb::CTableFunctionLocalInit
           (ExecutionContext *context,TableFunctionInitInput *data_p,
           GlobalTableFunctionState *gstate)

{
  _func_int **pp_Var1;
  _Head_base<0UL,_duckdb::CTableLocalInitData_*,_false> _Var2;
  pointer __p;
  ClientContext *pCVar3;
  pointer pCVar4;
  InvalidInputException *this;
  templated_unique_single_t result;
  CTableInternalInitInfo init_info;
  _Head_base<0UL,_duckdb::CTableLocalInitData_*,_false> local_70;
  _func_int **local_68;
  CTableInitData *local_60;
  GlobalTableFunctionState *local_58;
  _func_int **local_50;
  char local_48;
  string local_40;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid
            ((optional_ptr<const_duckdb::FunctionData,_true> *)gstate);
  pp_Var1 = gstate->_vptr_GlobalTableFunctionState;
  pCVar3 = (ClientContext *)operator_new(0x20);
  (pCVar3->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (pCVar3->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pCVar3->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (pCVar3->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pCVar3->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__CTableLocalInitData_019c9550;
  (pCVar3->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pCVar3->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (pCVar3->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  if (*(long *)(pp_Var1[4] + 0x18) == 0) {
    local_70._M_head_impl = (CTableLocalInitData *)0x0;
    context->client = pCVar3;
  }
  else {
    local_70._M_head_impl = (CTableLocalInitData *)pCVar3;
    pCVar4 = unique_ptr<duckdb::CTableLocalInitData,_std::default_delete<duckdb::CTableLocalInitData>,_true>
             ::operator->((unique_ptr<duckdb::CTableLocalInitData,_std::default_delete<duckdb::CTableLocalInitData>,_true>
                           *)&local_70);
    local_60 = &pCVar4->init_data;
    local_50 = gstate[10]._vptr_GlobalTableFunctionState;
    local_58 = gstate + 1;
    local_48 = '\x01';
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_68 = pp_Var1;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    (**(code **)(pp_Var1[4] + 0x18))(&local_68);
    _Var2._M_head_impl = local_70._M_head_impl;
    if (local_48 == '\0') {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      InvalidInputException::InvalidInputException(this,&local_40);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_70._M_head_impl = (CTableLocalInitData *)0x0;
    context->client = (ClientContext *)_Var2._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if (local_70._M_head_impl != (CTableLocalInitData *)0x0) {
    (*((local_70._M_head_impl)->super_LocalTableFunctionState)._vptr_LocalTableFunctionState[1])();
  }
  return (unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
          )(unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<LocalTableFunctionState> CTableFunctionLocalInit(ExecutionContext &context, TableFunctionInitInput &data_p,
                                                            GlobalTableFunctionState *gstate) {
	auto &bind_data = data_p.bind_data->Cast<CTableBindData>();
	auto result = make_uniq<CTableLocalInitData>();
	if (!bind_data.info.local_init) {
		return std::move(result);
	}

	CTableInternalInitInfo init_info(bind_data, result->init_data, data_p.column_ids, data_p.filters);
	bind_data.info.local_init(ToCInitInfo(init_info));
	if (!init_info.success) {
		throw InvalidInputException(init_info.error);
	}
	return std::move(result);
}